

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu1_v2.c
# Opt level: O2

MPP_RET hal_jpege_vepu1_deinit(void *hal)

{
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","enter hal %p\n","hal_jpege_vepu1_deinit",hal);
  }
  if (*(JpegeBits *)((long)hal + 0x10) != (JpegeBits)0x0) {
    jpege_bits_deinit(*(JpegeBits *)((long)hal + 0x10));
    *(undefined8 *)((long)hal + 0x10) = 0;
  }
  if (*hal != (MppDev)0x0) {
    mpp_dev_deinit(*hal);
    *(undefined8 *)hal = 0;
  }
  hal_jpege_vepu_deinit_rc((HalJpegeRc *)((long)hal + 0x130));
  if (*(void **)((long)hal + 0x18) != (void *)0x0) {
    mpp_osal_free("hal_jpege_vepu1_deinit",*(void **)((long)hal + 0x18));
  }
  *(undefined8 *)((long)hal + 0x18) = 0;
  if (*(void **)((long)hal + 0x20) != (void *)0x0) {
    mpp_osal_free("hal_jpege_vepu1_deinit",*(void **)((long)hal + 0x20));
  }
  *(undefined8 *)((long)hal + 0x20) = 0;
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","leave hal %p\n","hal_jpege_vepu1_deinit",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_jpege_vepu1_deinit(void *hal)
{
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    if (ctx->bits) {
        jpege_bits_deinit(ctx->bits);
        ctx->bits = NULL;
    }

    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }

    hal_jpege_vepu_deinit_rc(&ctx->hal_rc);

    MPP_FREE(ctx->regs);
    MPP_FREE(ctx->regs_out);
    hal_jpege_dbg_func("leave hal %p\n", hal);
    return MPP_OK;
}